

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

void stbi_decode_DXT45_alpha_block(uchar *uncompressed,uchar *compressed)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int bit;
  int idx;
  uchar decode_alpha [8];
  int next_bit;
  int i;
  uchar *compressed_local;
  uchar *uncompressed_local;
  
  decode_alpha[0] = '\x10';
  decode_alpha[1] = '\0';
  decode_alpha[2] = '\0';
  decode_alpha[3] = '\0';
  bit._0_1_ = *compressed;
  bit._1_1_ = compressed[1];
  if (bit._1_1_ < (byte)bit) {
    bit._2_1_ = (char)(((uint)(byte)bit * 6 + (uint)bit._1_1_) / 7);
    bit._3_1_ = (char)((ulong)((uint)(byte)bit * 5 + (uint)bit._1_1_ * 2) / 7);
    idx._0_1_ = (char)(((uint)(byte)bit * 4 + (uint)bit._1_1_ * 3) / 7);
    idx._1_1_ = (char)(((uint)(byte)bit * 3 + (uint)bit._1_1_ * 4) / 7);
    idx._2_1_ = (char)((ulong)((uint)(byte)bit * 2 + (uint)bit._1_1_ * 5) / 7);
    idx._3_1_ = (char)(((uint)(byte)bit + (uint)bit._1_1_ * 6) / 7);
  }
  else {
    bit._2_1_ = (char)(((uint)(byte)bit * 4 + (uint)bit._1_1_) / 5);
    bit._3_1_ = (char)((ulong)((uint)(byte)bit * 3 + (uint)bit._1_1_ * 2) / 5);
    idx._0_1_ = (char)((ulong)((uint)(byte)bit * 2 + (uint)bit._1_1_ * 3) / 5);
    idx._1_1_ = (char)(((uint)(byte)bit + (uint)bit._1_1_ * 4) / 5);
    idx._2_1_ = 0;
    idx._3_1_ = 0xff;
  }
  decode_alpha[4] = '\x03';
  decode_alpha[5] = '\0';
  decode_alpha[6] = '\0';
  decode_alpha[7] = '\0';
  for (; (int)decode_alpha._4_4_ < 0x40; decode_alpha._4_4_ = decode_alpha._4_4_ + 4) {
    iVar4 = (int)decode_alpha._0_4_ >> 3;
    bVar1 = (byte)decode_alpha._0_4_;
    iVar2 = decode_alpha._0_4_ + 1;
    iVar3 = decode_alpha._0_4_ + 2;
    decode_alpha._0_4_ = decode_alpha._0_4_ + 3;
    uncompressed[(int)decode_alpha._4_4_] =
         *(uchar *)((long)&bit +
                   (long)(int)(((int)(uint)compressed[iVar3 >> 3] >> ((byte)iVar3 & 7) & 1U) * 4 +
                               ((int)(uint)compressed[iVar2 >> 3] >> ((byte)iVar2 & 7) & 1U) * 2 +
                               ((int)(uint)compressed[iVar4] >> (bVar1 & 7) & 1U) & 7));
  }
  return;
}

Assistant:

void stbi_decode_DXT45_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 8*2;
	unsigned char decode_alpha[8];
	//	each alpha value gets 3 bits, and the 1st 2 bytes are the range
	decode_alpha[0] = compressed[0];
	decode_alpha[1] = compressed[1];
	if( decode_alpha[0] > decode_alpha[1] )
	{
		//	6 step intermediate
		decode_alpha[2] = (6*decode_alpha[0] + 1*decode_alpha[1]) / 7;
		decode_alpha[3] = (5*decode_alpha[0] + 2*decode_alpha[1]) / 7;
		decode_alpha[4] = (4*decode_alpha[0] + 3*decode_alpha[1]) / 7;
		decode_alpha[5] = (3*decode_alpha[0] + 4*decode_alpha[1]) / 7;
		decode_alpha[6] = (2*decode_alpha[0] + 5*decode_alpha[1]) / 7;
		decode_alpha[7] = (1*decode_alpha[0] + 6*decode_alpha[1]) / 7;
	} else
	{
		//	4 step intermediate, pluss full and none
		decode_alpha[2] = (4*decode_alpha[0] + 1*decode_alpha[1]) / 5;
		decode_alpha[3] = (3*decode_alpha[0] + 2*decode_alpha[1]) / 5;
		decode_alpha[4] = (2*decode_alpha[0] + 3*decode_alpha[1]) / 5;
		decode_alpha[5] = (1*decode_alpha[0] + 4*decode_alpha[1]) / 5;
		decode_alpha[6] = 0;
		decode_alpha[7] = 255;
	}
	for( i = 3; i < 16*4; i += 4 )
	{
		int idx = 0, bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 0;
		++next_bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 1;
		++next_bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 2;
		++next_bit;
		uncompressed[i] = decode_alpha[idx & 7];
	}
	//	done
}